

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O0

AssertionResult * __thiscall
iu_ExpressionFail_x_iutest_x_Monadic_Test::Body::anon_class_1_0_00000001::operator()
          (AssertionResult *__return_storage_ptr__,anon_class_1_0_00000001 *this)

{
  allocator<char> local_89;
  string local_88;
  anon_class_1_0_00000001 local_51;
  undefined1 local_50 [8];
  SPIFailureChecker iutest_failure_checker;
  anon_class_1_0_00000001 *this_local;
  
  iutest_failure_checker._48_8_ = this;
  iutest::detail::SPIFailureChecker::SPIFailureChecker((SPIFailureChecker *)local_50,kFatalFailure);
  operator()::anon_class_1_0_00000001::operator()(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"expansion: false",&local_89);
  iutest::detail::SPIFailureChecker::GetResult
            (__return_storage_ptr__,(SPIFailureChecker *)local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  iutest::detail::SPIFailureChecker::~SPIFailureChecker((SPIFailureChecker *)local_50);
  return __return_storage_ptr__;
}

Assistant:

IUTEST(ExpressionFail, Comparison)
{
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() == 41), "expansion: 42 == 41");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() != 42), "expansion: 42 != 42");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() <  41), "expansion: 42 < 41");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() <= 41), "expansion: 42 <= 41");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() >  43), "expansion: 42 > 43");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(f() >= 43), "expansion: 42 >= 43");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(g() &&  0), "expansion: false && 0");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT(g() ||  0), "expansion: false || 0");
}